

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindBase.cxx
# Opt level: O3

bool __thiscall
cmFindBase::ParseArguments
          (cmFindBase *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *argsIn)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  cmFindBase *pcVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  long *plVar6;
  value_type *pvVar7;
  ulong uVar8;
  value_type *pvVar9;
  pointer pbVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  undefined4 uVar14;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  shortArgs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  undefined1 local_b8 [32];
  cmFindBase *local_98;
  string *local_90;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  undefined1 local_68 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_48;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_38;
  
  uVar8 = (long)(argsIn->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(argsIn->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start >> 5;
  if (uVar8 < 2) {
    local_b8._0_8_ = local_b8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_b8,"called with incorrect number of arguments","");
    cmCommand::SetError((cmCommand *)this,(string *)local_b8);
    if ((undefined1 *)local_b8._0_8_ != local_b8 + 0x10) {
      operator_delete((void *)local_b8._0_8_,(ulong)(local_b8._16_8_ + 1));
    }
    bVar3 = false;
  }
  else {
    local_88.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_88.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_88.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_90 = (string *)&this->VariableDocumentation;
    uVar13 = 0;
    bVar3 = false;
    local_98 = this;
    do {
      uVar11 = (uint)uVar13;
      pbVar10 = (argsIn->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      if (bVar3) {
LAB_00345a3d:
        iVar5 = std::__cxx11::string::compare((char *)(pbVar10 + uVar13));
        if (iVar5 == 0) {
          uVar12 = uVar11 + 1;
          if (uVar12 < uVar8) {
            cmsys::SystemTools::GetPath
                      (&local_88,
                       (argsIn->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start[uVar12]._M_dataplus._M_p);
            uVar11 = uVar12;
          }
        }
        else {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&local_88,
                      (argsIn->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start + uVar13);
        }
      }
      else {
        iVar5 = std::__cxx11::string::compare((char *)(pbVar10 + uVar13));
        if (iVar5 != 0) {
          pbVar10 = (argsIn->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          goto LAB_00345a3d;
        }
        if (uVar11 + 1 < uVar8) {
          bVar3 = true;
          std::__cxx11::string::_M_assign(local_90);
          uVar11 = uVar11 + 1;
        }
        else {
          bVar3 = false;
        }
      }
      pcVar2 = local_98;
      uVar13 = (ulong)(uVar11 + 1);
    } while (uVar13 < uVar8);
    if ((ulong)((long)local_88.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_88.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start) < 0x21) {
      local_b8._0_8_ = local_b8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_b8,"called with incorrect number of arguments","");
      cmCommand::SetError((cmCommand *)local_98,(string *)local_b8);
LAB_00345aff:
      if ((value_type *)local_b8._0_8_ != (value_type *)(local_b8 + 0x10)) {
        operator_delete((void *)local_b8._0_8_,(ulong)(local_b8._16_8_ + 1));
      }
      bVar3 = false;
    }
    else {
      std::__cxx11::string::_M_assign((string *)&local_98->VariableName);
      bVar3 = CheckForVariableInCache(pcVar2);
      if (bVar3) {
        pcVar2->AlreadyInCache = true;
        bVar3 = true;
      }
      else {
        pcVar2->AlreadyInCache = false;
        cmFindCommon::SelectDefaultRootPathMode(&pcVar2->super_cmFindCommon);
        cmFindCommon::SelectDefaultMacMode(&pcVar2->super_cmFindCommon);
        if ((ulong)((long)local_88.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_88.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) < 0x21) {
          bVar3 = false;
        }
        else {
          local_38 = &(pcVar2->super_cmFindCommon).UserHintsArgs;
          local_40 = &(pcVar2->super_cmFindCommon).UserGuessArgs;
          local_48 = &pcVar2->Names;
          uVar14 = 1;
          uVar8 = 1;
          uVar11 = 2;
          bVar3 = false;
          do {
            iVar5 = std::__cxx11::string::compare
                              ((char *)(local_88.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start + uVar8));
            if (iVar5 == 0) {
              bVar3 = true;
              uVar14 = 1;
            }
            else {
              iVar5 = std::__cxx11::string::compare
                                ((char *)(local_88.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start + uVar8));
              if (iVar5 == 0) {
                bVar3 = true;
                uVar14 = 2;
              }
              else {
                iVar5 = std::__cxx11::string::compare
                                  ((char *)(local_88.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start + uVar8));
                if (iVar5 == 0) {
                  bVar3 = true;
                  uVar14 = 4;
                }
                else {
                  iVar5 = std::__cxx11::string::compare
                                    ((char *)(local_88.
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start + uVar8));
                  if (iVar5 == 0) {
                    bVar3 = true;
                    uVar14 = 3;
                  }
                  else {
                    iVar5 = std::__cxx11::string::compare
                                      ((char *)(local_88.
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start + uVar8));
                    pcVar2 = local_98;
                    if (iVar5 == 0) {
                      if (local_98->NamesPerDirAllowed != true) {
                        local_b8._0_8_ = local_b8 + 0x10;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)local_b8,"does not support NAMES_PER_DIR","");
                        cmCommand::SetError((cmCommand *)pcVar2,(string *)local_b8);
                        goto LAB_00345aff;
                      }
                      local_98->NamesPerDir = true;
                    }
                    else {
                      iVar5 = std::__cxx11::string::compare
                                        ((char *)(local_88.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + uVar8)
                                        );
                      if (iVar5 == 0) {
                        (local_98->super_cmFindCommon).NoDefaultPath = true;
                      }
                      else {
                        bVar4 = cmFindCommon::CheckCommonArgument
                                          (&local_98->super_cmFindCommon,
                                           local_88.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start + uVar8);
                        if (!bVar4) {
                          switch(uVar14) {
                          case 1:
                            std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::push_back(local_48,local_88.
                                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start + uVar8);
                            uVar14 = 1;
                            break;
                          case 2:
                            std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::push_back(local_40,local_88.
                                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start + uVar8);
                            uVar14 = 2;
                            break;
                          case 3:
                            cmFindCommon::AddPathSuffix
                                      (&local_98->super_cmFindCommon,
                                       local_88.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start + uVar8);
                            uVar14 = 3;
                            break;
                          case 4:
                            std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::push_back(local_38,local_88.
                                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start + uVar8);
                            uVar14 = 4;
                          }
                          goto switchD_00345c90_default;
                        }
                      }
                    }
                    uVar14 = 0;
                  }
                }
              }
            }
switchD_00345c90_default:
            uVar8 = (ulong)uVar11;
            uVar11 = uVar11 + 1;
          } while (uVar8 < (ulong)((long)local_88.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_88.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 5));
        }
        pcVar2 = local_98;
        if ((local_98->VariableDocumentation)._M_string_length == 0) {
          std::__cxx11::string::_M_replace((ulong)local_90,0,(char *)0x0,0x4a6487);
          __rhs = (pcVar2->Names).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
          pbVar1 = (pcVar2->Names).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if (__rhs == pbVar1) {
            std::__cxx11::string::append((char *)local_90);
          }
          else {
            if ((long)pbVar1 - (long)__rhs == 0x20) {
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_68,"the ",__rhs);
              plVar6 = (long *)std::__cxx11::string::append(local_68);
              local_b8._0_8_ = local_b8 + 0x10;
              pvVar9 = (value_type *)(plVar6 + 2);
              if ((value_type *)*plVar6 == pvVar9) {
                local_b8._16_8_ = (pvVar9->_M_dataplus)._M_p;
                local_b8._24_8_ = plVar6[3];
              }
              else {
                local_b8._16_8_ = (pvVar9->_M_dataplus)._M_p;
                local_b8._0_8_ = (value_type *)*plVar6;
              }
              local_b8._8_8_ = plVar6[1];
              *plVar6 = (long)pvVar9;
              plVar6[1] = 0;
              *(undefined1 *)(plVar6 + 2) = 0;
              std::__cxx11::string::_M_append((char *)local_90,local_b8._0_8_);
            }
            else {
              std::__cxx11::string::append((char *)local_90);
              local_68._0_8_ =
                   (pcVar2->Names).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              local_68._8_8_ =
                   (pcVar2->Names).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish + -1;
              cmJoin<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                        ((string *)local_b8,
                         (cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          *)local_68,", ");
              std::__cxx11::string::_M_append((char *)local_90,local_b8._0_8_);
              pvVar9 = (value_type *)(local_b8 + 0x10);
              if ((value_type *)local_b8._0_8_ != pvVar9) {
                operator_delete((void *)local_b8._0_8_,(ulong)(local_b8._16_8_ + 1));
              }
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_68," or ",
                             (pcVar2->Names).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish + -1);
              plVar6 = (long *)std::__cxx11::string::append(local_68);
              pvVar7 = (value_type *)(plVar6 + 2);
              if ((value_type *)*plVar6 == pvVar7) {
                local_b8._16_8_ = (pvVar7->_M_dataplus)._M_p;
                local_b8._24_8_ = plVar6[3];
              }
              else {
                local_b8._16_8_ = (pvVar7->_M_dataplus)._M_p;
                pvVar9 = (value_type *)*plVar6;
              }
              local_b8._8_8_ = plVar6[1];
              *plVar6 = (long)pvVar7;
              plVar6[1] = 0;
              *(undefined1 *)(plVar6 + 2) = 0;
              local_b8._0_8_ = pvVar9;
              std::__cxx11::string::_M_append((char *)local_90,(ulong)pvVar9);
            }
            if ((value_type *)local_b8._0_8_ != (value_type *)(local_b8 + 0x10)) {
              operator_delete((void *)local_b8._0_8_,(ulong)(local_b8._16_8_ + 1));
            }
            if ((pointer)local_68._0_8_ != (pointer)(local_68 + 0x10)) {
              operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
            }
          }
        }
        if (!bVar3) {
          __x = &pcVar2->Names;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_b8,__x);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::_M_erase_at_end(__x,(__x->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(__x,(value_type *)local_b8._0_8_);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &(pcVar2->super_cmFindCommon).UserGuessArgs,
                     *(pointer *)
                      ((long)&(pcVar2->super_cmFindCommon).UserGuessArgs.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data + 8),
                     (value_type *)(local_b8._0_8_ + 0x20),local_b8._8_8_);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_b8);
        }
        ExpandPaths(pcVar2);
        bVar3 = true;
        cmFindCommon::ComputeFinalPaths(&pcVar2->super_cmFindCommon);
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_88);
  }
  return bVar3;
}

Assistant:

bool cmFindBase::ParseArguments(std::vector<std::string> const& argsIn)
{
  if (argsIn.size() < 2) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }

  // copy argsIn into args so it can be modified,
  // in the process extract the DOC "documentation"
  size_t size = argsIn.size();
  std::vector<std::string> args;
  bool foundDoc = false;
  for (unsigned int j = 0; j < size; ++j) {
    if (foundDoc || argsIn[j] != "DOC") {
      if (argsIn[j] == "ENV") {
        if (j + 1 < size) {
          j++;
          cmSystemTools::GetPath(args, argsIn[j].c_str());
        }
      } else {
        args.push_back(argsIn[j]);
      }
    } else {
      if (j + 1 < size) {
        foundDoc = true;
        this->VariableDocumentation = argsIn[j + 1];
        j++;
        if (j >= size) {
          break;
        }
      }
    }
  }
  if (args.size() < 2) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }
  this->VariableName = args[0];
  if (this->CheckForVariableInCache()) {
    this->AlreadyInCache = true;
    return true;
  }
  this->AlreadyInCache = false;

  // Find the current root path mode.
  this->SelectDefaultRootPathMode();

  // Find the current bundle/framework search policy.
  this->SelectDefaultMacMode();

  bool newStyle = false;
  enum Doing
  {
    DoingNone,
    DoingNames,
    DoingPaths,
    DoingPathSuffixes,
    DoingHints
  };
  Doing doing = DoingNames; // assume it starts with a name
  for (unsigned int j = 1; j < args.size(); ++j) {
    if (args[j] == "NAMES") {
      doing = DoingNames;
      newStyle = true;
    } else if (args[j] == "PATHS") {
      doing = DoingPaths;
      newStyle = true;
    } else if (args[j] == "HINTS") {
      doing = DoingHints;
      newStyle = true;
    } else if (args[j] == "PATH_SUFFIXES") {
      doing = DoingPathSuffixes;
      newStyle = true;
    } else if (args[j] == "NAMES_PER_DIR") {
      doing = DoingNone;
      if (this->NamesPerDirAllowed) {
        this->NamesPerDir = true;
      } else {
        this->SetError("does not support NAMES_PER_DIR");
        return false;
      }
    } else if (args[j] == "NO_SYSTEM_PATH") {
      doing = DoingNone;
      this->NoDefaultPath = true;
    } else if (this->CheckCommonArgument(args[j])) {
      doing = DoingNone;
      // Some common arguments were accidentally supported by CMake
      // 2.4 and 2.6.0 in the short-hand form of the command, so we
      // must support it even though it is not documented.
    } else if (doing == DoingNames) {
      this->Names.push_back(args[j]);
    } else if (doing == DoingPaths) {
      this->UserGuessArgs.push_back(args[j]);
    } else if (doing == DoingHints) {
      this->UserHintsArgs.push_back(args[j]);
    } else if (doing == DoingPathSuffixes) {
      this->AddPathSuffix(args[j]);
    }
  }

  if (this->VariableDocumentation.empty()) {
    this->VariableDocumentation = "Where can ";
    if (this->Names.empty()) {
      this->VariableDocumentation += "the (unknown) library be found";
    } else if (this->Names.size() == 1) {
      this->VariableDocumentation +=
        "the " + this->Names.front() + " library be found";
    } else {
      this->VariableDocumentation += "one of the ";
      this->VariableDocumentation +=
        cmJoin(cmMakeRange(this->Names).retreat(1), ", ");
      this->VariableDocumentation +=
        " or " + this->Names.back() + " libraries be found";
    }
  }

  // look for old style
  // FIND_*(VAR name path1 path2 ...)
  if (!newStyle) {
    // All the short-hand arguments have been recorded as names.
    std::vector<std::string> shortArgs = this->Names;
    this->Names.clear(); // clear out any values in Names
    this->Names.push_back(shortArgs[0]);
    this->UserGuessArgs.insert(this->UserGuessArgs.end(),
                               shortArgs.begin() + 1, shortArgs.end());
  }
  this->ExpandPaths();

  this->ComputeFinalPaths();

  return true;
}